

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

ScalarFunction * duckdb::UUIDv4Fun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  undefined1 null_handling;
  undefined8 bind_lambda;
  vector<duckdb::LogicalType,_true> local_68;
  LogicalType local_50;
  LogicalType local_38;
  
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_50,UUID);
  bind_lambda = (bind_lambda_function_t)0x0;
  null_handling = 0x77;
  LogicalType::LogicalType(&local_38,INVALID);
  ScalarFunction::ScalarFunction
            (in_RDI,&local_68,&local_50,(scalar_function_t *)&stack0xffffffffffffff78,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,RandomInitLocalState,(LogicalType)ZEXT824(&local_38),
             CONSISTENT,null_handling,(bind_lambda_function_t)bind_lambda);
  LogicalType::~LogicalType(&local_38);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff78,(_Any_data *)&stack0xffffffffffffff78,
               __destroy_functor);
  LogicalType::~LogicalType(&local_50);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  (in_RDI->super_BaseScalarFunction).stability = VOLATILE;
  return in_RDI;
}

Assistant:

ScalarFunction UUIDv4Fun::GetFunction() {
	ScalarFunction uuid_v4_function({}, LogicalType::UUID, GenerateUUIDv4Function, nullptr, nullptr, nullptr,
	                                RandomInitLocalState);
	// generate a random uuid v4
	uuid_v4_function.stability = FunctionStability::VOLATILE;
	return uuid_v4_function;
}